

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O2

int gzbuffer(gzFile file,uint size)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = -1;
  if (((file != (gzFile)0x0) &&
      (((file[1].have == 0x79b1 || (file[1].have == 0x1c4f)) && (-1 < (int)size)))) &&
     ((int)file[1].pos == 0)) {
    uVar2 = 2;
    if (2 < size) {
      uVar2 = size;
    }
    *(uint *)((long)&file[1].pos + 4) = uVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ZEXPORT gzbuffer(file, size)
    gzFile file;
    unsigned size;
{
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return -1;

    /* make sure we haven't already allocated memory */
    if (state->size != 0)
        return -1;

    /* check and set requested size */
    if ((size << 1) < size)
        return -1;              /* need to be able to double it */
    if (size < 2)
        size = 2;               /* need two bytes to check magic header */
    state->want = size;
    return 0;
}